

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_Stop(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  DObject *this;
  bool bVar1;
  bool local_3b;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xecf,"int AF_AActor_A_Stop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    this = (DObject *)(param->field_0).field_1.a;
    local_3b = true;
    if (this != (DObject *)0x0) {
      local_3b = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    }
    if (local_3b != false) {
      TVector3<double>::Zero((TVector3<double> *)(this + 5));
      if (((this[0xe]._vptr_DObject != (_func_int **)0x0) &&
          ((DObject *)*this[0xe]._vptr_DObject == this)) &&
         (((ulong)this[0xe]._vptr_DObject[0x1d] & 0x2000) == 0)) {
        APlayerPawn::PlayIdle((APlayerPawn *)*this[0xe]._vptr_DObject);
        TVector2<double>::Zero((TVector2<double> *)(this[0xe]._vptr_DObject + 0x10));
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xecf,"int AF_AActor_A_Stop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xecf,"int AF_AActor_A_Stop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Stop)
{
	PARAM_SELF_PROLOGUE(AActor);
	self->Vel.Zero();
	if (self->player && self->player->mo == self && !(self->player->cheats & CF_PREDICTING))
	{
		self->player->mo->PlayIdle();
		self->player->Vel.Zero();
	}
	return 0;
}